

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void phmap::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *ctrl,size_t capacity)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  long lVar3;
  ctrl_t *pos;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4[8] = 0x7e;
  auVar4._0_8_ = 0x7e7e7e7e7e7e7e7e;
  auVar4[9] = 0x7e;
  auVar4[10] = 0x7e;
  auVar4[0xb] = 0x7e;
  auVar4[0xc] = 0x7e;
  auVar4[0xd] = 0x7e;
  auVar4[0xe] = 0x7e;
  auVar4[0xf] = 0x7e;
  auVar5._8_8_ = 0x8080808080808080;
  auVar5._0_8_ = 0x8080808080808080;
  for (lVar3 = 0; capacity + 1 != lVar3; lVar3 = lVar3 + 0x10) {
    auVar1 = vpshufb_avx(auVar4,*(undefined1 (*) [16])(ctrl + lVar3));
    auVar1 = vpor_avx(auVar1,auVar5);
    *(undefined1 (*) [16])(ctrl + lVar3) = auVar1;
  }
  uVar2 = *(undefined8 *)(ctrl + 8);
  *(undefined8 *)(ctrl + capacity + 1) = *(undefined8 *)ctrl;
  *(undefined8 *)(ctrl + capacity + 1 + 8) = uVar2;
  ctrl[capacity] = -1;
  return;
}

Assistant:

inline void ConvertDeletedToEmptyAndFullToDeleted(
    ctrl_t* ctrl, size_t capacity) 
{
    assert(ctrl[capacity] == kSentinel);
    assert(IsValidCapacity(capacity));
    for (ctrl_t* pos = ctrl; pos != ctrl + capacity + 1; pos += Group::kWidth) {
        Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
    }
    // Copy the cloned ctrl bytes.
    std::memcpy(ctrl + capacity + 1, ctrl, Group::kWidth);
    ctrl[capacity] = kSentinel;
}